

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O3

Expression * __thiscall soul::Optimisations::Inliner::cloneExpression(Inliner *this,Expression *old)

{
  Module *pMVar1;
  int iVar2;
  long lVar3;
  Constant *pCVar4;
  Expression *pEVar5;
  Expression *args_2;
  BinaryOperator *pBVar6;
  UnaryOperator *pUVar7;
  TypeCast *pTVar8;
  undefined4 extraout_var;
  Variable *pVVar9;
  ArrayElement *pAVar10;
  StructElement *pSVar11;
  ProcessorProperty *pPVar12;
  void *in_R8;
  undefined1 auVar13 [16];
  
  lVar3 = __dynamic_cast(old,&heart::Expression::typeinfo,&heart::Constant::typeinfo);
  if (lVar3 != 0) {
    pCVar4 = PoolAllocator::allocate<soul::heart::Constant,soul::CodeLocation&,soul::Value&>
                       (&this->module->allocator->pool,(CodeLocation *)(lVar3 + 8),
                        (Value *)(lVar3 + 0x18));
    return &pCVar4->super_Expression;
  }
  lVar3 = __dynamic_cast(old,&heart::Expression::typeinfo,&heart::BinaryOperator::typeinfo);
  if (lVar3 != 0) {
    pMVar1 = this->module;
    pEVar5 = cloneExpression(this,*(Expression **)(lVar3 + 0x18));
    args_2 = cloneExpression(this,*(Expression **)(lVar3 + 0x20));
    pBVar6 = PoolAllocator::
             allocate<soul::heart::BinaryOperator,soul::CodeLocation&,soul::heart::Expression&,soul::heart::Expression&,soul::BinaryOp::Op&>
                       (&pMVar1->allocator->pool,(CodeLocation *)(lVar3 + 8),pEVar5,args_2,
                        (Op *)(lVar3 + 0x28));
    return &pBVar6->super_Expression;
  }
  lVar3 = __dynamic_cast(old,&heart::Expression::typeinfo,&heart::UnaryOperator::typeinfo);
  if (lVar3 != 0) {
    pMVar1 = this->module;
    pEVar5 = cloneExpression(this,*(Expression **)(lVar3 + 0x18));
    pUVar7 = PoolAllocator::
             allocate<soul::heart::UnaryOperator,soul::CodeLocation&,soul::heart::Expression&,soul::UnaryOp::Op&>
                       (&pMVar1->allocator->pool,(CodeLocation *)(lVar3 + 8),pEVar5,
                        (Op *)(lVar3 + 0x20));
    return &pUVar7->super_Expression;
  }
  lVar3 = __dynamic_cast(old,&heart::Expression::typeinfo,&heart::TypeCast::typeinfo);
  if (lVar3 != 0) {
    pMVar1 = this->module;
    pEVar5 = cloneExpression(this,*(Expression **)(lVar3 + 0x18));
    pTVar8 = PoolAllocator::
             allocate<soul::heart::TypeCast,soul::CodeLocation&,soul::heart::Expression&,soul::Type&>
                       (&pMVar1->allocator->pool,(CodeLocation *)(lVar3 + 8),pEVar5,
                        (Type *)(lVar3 + 0x20));
    return &pTVar8->super_Expression;
  }
  iVar2 = 0;
  auVar13 = __dynamic_cast(old,&heart::Expression::typeinfo,&heart::PureFunctionCall::typeinfo);
  if (auVar13._0_8_ != (__fn *)0x0) {
    iVar2 = clone(this,auVar13._0_8_,auVar13._8_8_,iVar2,in_R8);
    return (Expression *)CONCAT44(extraout_var,iVar2);
  }
  pVVar9 = (Variable *)__dynamic_cast(old,&heart::Expression::typeinfo,&heart::Variable::typeinfo,0)
  ;
  if (pVVar9 != (Variable *)0x0) {
    pVVar9 = getRemappedVariable(this,pVVar9);
    return &pVVar9->super_Expression;
  }
  pAVar10 = (ArrayElement *)
            __dynamic_cast(old,&heart::Expression::typeinfo,&heart::ArrayElement::typeinfo,0);
  if (pAVar10 != (ArrayElement *)0x0) {
    pAVar10 = cloneArrayElement(this,pAVar10);
    return &pAVar10->super_Expression;
  }
  pSVar11 = (StructElement *)
            __dynamic_cast(old,&heart::Expression::typeinfo,&heart::StructElement::typeinfo,0);
  if (pSVar11 != (StructElement *)0x0) {
    pSVar11 = cloneStructElement(this,pSVar11);
    return &pSVar11->super_Expression;
  }
  lVar3 = __dynamic_cast(old,&heart::Expression::typeinfo,&heart::ProcessorProperty::typeinfo,0);
  if (lVar3 != 0) {
    pPVar12 = PoolAllocator::
              allocate<soul::heart::ProcessorProperty,soul::CodeLocation&,soul::heart::ProcessorProperty::Property_const&>
                        (&this->module->allocator->pool,(CodeLocation *)(lVar3 + 8),
                         (Property *)(lVar3 + 0x18));
    return &pPVar12->super_Expression;
  }
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

heart::Expression& cloneExpression (heart::Expression& old)
        {
            if (auto c = cast<heart::Constant> (old))
                return module.allocate<heart::Constant> (c->location, c->value);

            if (auto b = cast<heart::BinaryOperator> (old))
                return module.allocate<heart::BinaryOperator> (b->location,
                                                               cloneExpression (b->lhs),
                                                               cloneExpression (b->rhs),
                                                               b->operation);

            if (auto u = cast<heart::UnaryOperator> (old))
                return module.allocate<heart::UnaryOperator> (u->location, cloneExpression (u->source), u->operation);

            if (auto t = cast<heart::TypeCast> (old))
                return module.allocate<heart::TypeCast> (t->location, cloneExpression (t->source), t->destType);

            if (auto f = cast<heart::PureFunctionCall> (old))
                return clone (*f);

            if (auto v = cast<heart::Variable> (old))
                return getRemappedVariable (*v);

            if (auto s = cast<heart::ArrayElement> (old))
                return cloneArrayElement (*s);

            if (auto s = cast<heart::StructElement> (old))
                return cloneStructElement (*s);

            auto pp = cast<heart::ProcessorProperty> (old);
            return module.allocate<heart::ProcessorProperty> (pp->location, pp->property);
        }